

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# password.c
# Opt level: O3

char * password_hash(char *password,char *algo,char *salt,int cost)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  ssize_t sVar5;
  ushort **ppuVar6;
  time_t tVar7;
  char *__s;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  char format [10];
  char local_40 [16];
  
  if (password == (char *)0x0) {
    if (msgno < 0) {
      return (char *)0x0;
    }
    password_hash_cold_9();
    return (char *)0x0;
  }
  if (cost - 0x20U < 0xffffffe4) {
    if (msgno < 0) {
      return (char *)0x0;
    }
    fprintf(_stderr,"password_hash: invalid bcrypt cost parameter specified: %d\n",(ulong)(uint)cost
           );
    return (char *)0x0;
  }
  if (salt == (char *)0x0) {
    pcVar4 = (char *)calloc(1,0x17);
    if (pcVar4 == (char *)0x0) {
      if (msgno < 0) {
        return (char *)0x0;
      }
      password_hash_cold_7();
    }
    else {
      iVar1 = open("/dev/urandom",0);
      if (iVar1 < 0) {
LAB_001017da:
        lVar11 = 0;
        tVar7 = time((time_t *)0x0);
        srand((uint)tVar7);
        do {
          iVar1 = rand();
          pcVar4[lVar11] = pcVar4[lVar11] ^ (byte)(int)(((double)iVar1 * 255.0) / 2147483647.0);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x11);
      }
      else {
        uVar10 = 0;
        do {
          sVar5 = read(iVar1,pcVar4 + uVar10,0x11 - uVar10);
          if ((int)(uint)sVar5 < 0) {
            close(iVar1);
            goto LAB_001017da;
          }
          uVar10 = uVar10 + ((uint)sVar5 & 0x7fffffff);
        } while (uVar10 < 0x11);
        close(iVar1);
      }
      uVar2 = to_base64(pcVar4,0x11,0x16);
      if (-1 < (int)uVar2) {
LAB_00101832:
        pcVar4[uVar2] = '\0';
        sVar3 = strlen(pcVar4);
        goto LAB_00101844;
      }
      free(pcVar4);
    }
    if (0 < msgno) {
      password_hash_cold_8();
    }
  }
  else {
    sVar3 = strlen(salt);
    pcVar4 = (char *)malloc(sVar3 + 1);
    if (pcVar4 == (char *)0x0) {
      if (msgno < 1) {
        return (char *)0x0;
      }
      password_hash_cold_2();
      return (char *)0x0;
    }
    memcpy(pcVar4,salt,sVar3);
    pcVar4[sVar3] = '\0';
    if (sVar3 < 0x16) {
      free(pcVar4);
      if (msgno < 1) {
        return (char *)0x0;
      }
      fprintf(_stderr,"password_hash: provided salt is too short: %ld expecting %ld\n",sVar3,0x16);
      return (char *)0x0;
    }
    ppuVar6 = __ctype_b_loc();
    sVar9 = 0;
    do {
      if (((pcVar4[sVar9] & 0xfeU) != 0x2e) && (((*ppuVar6)[pcVar4[sVar9]] & 8) == 0)) {
        uVar2 = to_base64(pcVar4,sVar3,sVar3);
        if ((int)uVar2 < 0) {
          free(pcVar4);
          if (msgno < 1) {
            return (char *)0x0;
          }
          password_hash_cold_1();
          return (char *)0x0;
        }
        goto LAB_00101832;
      }
      sVar9 = sVar9 + 1;
    } while (sVar3 != sVar9);
LAB_00101844:
    if (0 < msgno) {
      fprintf(_stderr,
              "password_hash: parameters\n  password  => %s\n  algorithm => %s\n  salt      => %s\n  cost      => %d\n"
              ,password,algo,pcVar4,(ulong)(uint)cost);
    }
    local_40[8] = '\0';
    local_40[9] = '\0';
    local_40[0] = '\0';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[7] = '\0';
    sprintf(local_40,"$2y$%02d$",(ulong)(uint)cost);
    sVar9 = strlen(local_40);
    __s = (char *)malloc(sVar9 + sVar3 + 1);
    if (__s == (char *)0x0) {
      if (0 < msgno) {
        password_hash_cold_6();
      }
      free(pcVar4);
    }
    else {
      sprintf(__s,"%s%s",local_40,pcVar4);
      __s[sVar9 + sVar3] = '\0';
      free(pcVar4);
      if (1 < msgno) {
        fprintf(_stderr,"password_hash: hash => %s\n",__s);
      }
      pcVar4 = (char *)calloc(1,0x3d);
      if (pcVar4 == (char *)0x0) {
        free(__s);
        if (0 < msgno) {
          password_hash_cold_5();
        }
      }
      else {
        pcVar8 = _crypt_blowfish_rn(password,__s,pcVar4,0x3d);
        free(__s);
        if (pcVar8 == (char *)0x0) {
          free(pcVar4);
          if (0 < msgno) {
            password_hash_cold_4();
          }
        }
        else {
          sVar3 = strlen(pcVar4);
          if (0xd < sVar3) {
            return pcVar4;
          }
          free(pcVar4);
          if (0 < msgno) {
            password_hash_cold_3();
          }
        }
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *
password_hash(const char *password, const char *algo,
              const char *salt, const int cost)
{
    char *gensalt = NULL, *hash = NULL, *output = NULL;
    char format[FORMAT_LEN];
    size_t output_len = BLOWFISH_LEN + 1;
    size_t salt_required_len = BCRYPT_BLOWFISH_SALT_REQUIRED_LEN;
    size_t format_len, salt_len;

    if (!password) {
        msg_error(hash, "missing password\n");
        return NULL;
    }

    if (cost < 4 || cost > 31) {
        msg_error(hash, "invalid bcrypt cost parameter specified: %d\n", cost);
        return NULL;
    }

    if (salt) {
        salt_len = strlen(salt);
        gensalt = (char *)malloc(salt_len + 1);
        if (!gensalt) {
            msg_verbose(hash, "memory allocate\n");
            return NULL;
        }
        memcpy(gensalt, salt, salt_len);
        gensalt[salt_len] = 0;

        if (salt_len < salt_required_len) {
            free(gensalt);
            msg_verbose(hash, "provided salt is too short: %ld expecting %ld\n",
                        salt_len, salt_required_len);
            return NULL;
        } else if (is_alphabet(gensalt, salt_len) < 0) {
            int len = to_base64(gensalt, salt_len, salt_len);
            if (len < 0) {
                free(gensalt);
                msg_verbose(hash, "provided salt is not alphabet\n");
                return NULL;
            }
            gensalt[len] = 0;
            salt_len = strlen(gensalt);
        }
    } else {
        gensalt = make_salt(salt_required_len);
        if (!gensalt) {
            msg_verbose(hash, "generated salt\n");
            return NULL;
        }
        salt_len = strlen(gensalt);
    }

    msg_verbose(hash,"parameters\n"
                "  password  => %s\n"
                "  algorithm => %s\n"
                "  salt      => %s\n"
                "  cost      => %d\n",
                password, algo, gensalt, cost);

    memset(format, 0, sizeof(format));
    sprintf(format, "$2y$%02d$", cost);
    format_len = strlen(format);

    hash = malloc(format_len + salt_len + 1);
    if (!hash) {
        msg_verbose(hash, "memory allocate\n");
        free(gensalt);
        return NULL;
    }

    sprintf(hash, "%s%s", format, gensalt);
    hash[format_len + salt_len] = 0;

    free(gensalt);

    msg_verbose_ex(hash, 2, "hash => %s\n", hash);

    output = malloc(output_len);
    if (!output) {
        free(hash);
        msg_verbose(hash, "memory allocate\n");
        return NULL;
    }

    memset(output, 0, output_len);

    if (_crypt_blowfish_rn(password, hash, output, output_len) == NULL) {
        free(hash);
        free(output);
        msg_verbose(hash, "blowfish run.\n");
        return NULL;
    }

    free(hash);

    if (strlen(output) <= 13) {
        free(output);
        msg_verbose(hash, "hash length.\n");
        return NULL;
    }

    return output;
}